

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.h
# Opt level: O0

string * __thiscall
cmExtraEclipseCDT4Generator::GetName_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraEclipseCDT4Generator *this)

{
  cmExtraEclipseCDT4Generator *this_local;
  
  GetActualName_abi_cxx11_();
  return __return_storage_ptr__;
}

Assistant:

virtual std::string GetName() const {
    return cmExtraEclipseCDT4Generator::GetActualName();
  }